

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O0

void __thiscall
QIBusPlatformInputContext::commitText(QIBusPlatformInputContext *this,QDBusVariant *text)

{
  bool bVar1;
  QObject *t_00;
  QMessageLogger *in_RSI;
  QIBusText *in_RDI;
  long in_FS_OFFSET;
  QObject *input;
  QInputMethodEvent event;
  QIBusText t;
  QDBusArgument arg;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QIBusText *in_stack_fffffffffffffe38;
  QIBusText *v;
  QInputMethodEvent local_188 [16];
  char *in_stack_fffffffffffffe88;
  QDebug local_108 [8];
  QDebug local_c8;
  undefined1 local_c0 [112];
  QDBusArgument local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  v = in_RDI;
  QCoreApplication::instance();
  t_00 = (QObject *)QGuiApplication::focusObject();
  if (t_00 != (QObject *)0x0) {
    local_50.d = (QDBusArgumentPrivate *)0xaaaaaaaaaaaaaaaa;
    QDBusVariant::variant((QDBusVariant *)in_stack_fffffffffffffe38);
    qvariant_cast<QDBusArgument>((QVariant *)v);
    QVariant::~QVariant(&local_28);
    memset(local_c0,0xaa,0x70);
    QIBusText::QIBusText(in_RDI);
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    lcQpaInputMethods();
    anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe38);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11e199);
      QMessageLogger::QMessageLogger
                (in_RSI,(char *)t_00,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffe38,
                 (char *)0x11e1b2);
      QMessageLogger::debug();
      QDBusArgument::currentSignature();
      QDebug::operator<<((QDebug *)in_RSI,(QString *)t_00);
      QString::~QString((QString *)0x11e1fe);
      QDebug::~QDebug(&local_c8);
      local_30 = local_30 & 0xffffffffffffff00;
    }
    operator>>((QDBusArgument *)in_RDI,in_stack_fffffffffffffe38);
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    lcQpaInputMethods();
    anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe38);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
      anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11e280);
      QMessageLogger::QMessageLogger
                (in_RSI,(char *)t_00,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffe38,
                 (char *)0x11e299);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)v,in_stack_fffffffffffffe88);
      QDebug::operator<<((QDebug *)in_RSI,(QString *)t_00);
      QDebug::~QDebug(local_108);
      local_40 = local_40 & 0xffffffffffffff00;
    }
    memset(local_188,0xaa,0x60);
    QInputMethodEvent::QInputMethodEvent(local_188);
    QInputMethodEvent::setCommitString((QString *)local_188,(int)local_c0 + 0x20,0);
    QCoreApplication::sendEvent(t_00,(QEvent *)local_188);
    QString::QString((QString *)0x11e341);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe38);
    QString::~QString((QString *)0x11e362);
    QList<QInputMethodEvent::Attribute>::clear((QList<QInputMethodEvent::Attribute> *)in_RDI);
    QInputMethodEvent::~QInputMethodEvent(local_188);
    QIBusText::~QIBusText(in_RDI);
    QDBusArgument::~QDBusArgument(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusPlatformInputContext::commitText(const QDBusVariant &text)
{
    QObject *input = qApp->focusObject();
    if (!input)
        return;

    const QDBusArgument arg = qvariant_cast<QDBusArgument>(text.variant());

    QIBusText t;
    qCDebug(lcQpaInputMethods) << arg.currentSignature();
    arg >> t;
    qCDebug(lcQpaInputMethods) << "commit text:" << t.text;

    QInputMethodEvent event;
    event.setCommitString(t.text);
    QCoreApplication::sendEvent(input, &event);

    d->predit = QString();
    d->attributes.clear();
}